

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

string * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::type_name(string *__return_storage_ptr__,
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(this->m_type) {
  case null:
    pcVar2 = "null";
    paVar1 = &local_9;
    break;
  case object:
    pcVar2 = "object";
    paVar1 = &local_a;
    break;
  case array:
    pcVar2 = "array";
    paVar1 = &local_b;
    break;
  case string:
    pcVar2 = "string";
    paVar1 = &local_c;
    break;
  case boolean:
    pcVar2 = "boolean";
    paVar1 = &local_d;
    break;
  default:
    pcVar2 = "number";
    paVar1 = &local_f;
    break;
  case discarded:
    pcVar2 = "discarded";
    paVar1 = &local_e;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string type_name() const
    {
        {
            switch (m_type)
            {
                case value_t::null:
                    return "null";
                case value_t::object:
                    return "object";
                case value_t::array:
                    return "array";
                case value_t::string:
                    return "string";
                case value_t::boolean:
                    return "boolean";
                case value_t::discarded:
                    return "discarded";
                default:
                    return "number";
            }
        }
    }